

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O3

bool __thiscall
cmServerProtocol1::DoActivate(cmServerProtocol1 *this,cmServerRequest *request,string *errorMessage)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmake *this_00;
  cmState *state;
  size_t __n;
  size_type __n_00;
  bool bVar2;
  int iVar3;
  Value *pVVar4;
  long lVar5;
  undefined8 *puVar6;
  __normal_iterator<cmake::GeneratorInfo_*,_std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>_>
  _Var7;
  long *plVar8;
  GeneratorInfo *pGVar9;
  size_type *psVar10;
  undefined8 uVar11;
  _Alloc_hider _Var12;
  long lVar13;
  __normal_iterator<cmake::GeneratorInfo_*,_std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>_>
  __last;
  Value *this_01;
  anon_class_16_2_b7cf16a7_for__M_pred __pred;
  string generator;
  string cachePath;
  string buildDirectory;
  string extraGenerator;
  string sourceDirectory;
  string platform;
  string toolset;
  vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> generators;
  string local_240;
  string local_220;
  GeneratorInfo *local_200;
  GeneratorInfo *local_1f8;
  string local_1f0;
  GeneratorInformation local_1d0;
  string local_110;
  string local_f0;
  string local_d0;
  GeneratorInfo *local_b0;
  string local_a8;
  string local_88;
  vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_01 = &request->Data;
  pVVar4 = Json::Value::operator[](this_01,&kSOURCE_DIRECTORY_KEY_abi_cxx11_);
  Json::Value::asString_abi_cxx11_(&local_d0,pVVar4);
  pVVar4 = Json::Value::operator[](this_01,&kBUILD_DIRECTORY_KEY_abi_cxx11_);
  Json::Value::asString_abi_cxx11_(&local_110,pVVar4);
  pVVar4 = Json::Value::operator[](this_01,&kGENERATOR_KEY_abi_cxx11_);
  Json::Value::asString_abi_cxx11_(&local_1f0,pVVar4);
  pVVar4 = Json::Value::operator[](this_01,&kEXTRA_GENERATOR_KEY_abi_cxx11_);
  Json::Value::asString_abi_cxx11_(&local_f0,pVVar4);
  pVVar4 = Json::Value::operator[](this_01,&kTOOLSET_KEY_abi_cxx11_);
  Json::Value::asString_abi_cxx11_(&local_88,pVVar4);
  pVVar4 = Json::Value::operator[](this_01,&kPLATFORM_KEY_abi_cxx11_);
  Json::Value::asString_abi_cxx11_(&local_a8,pVVar4);
  if (local_110._M_string_length == 0) {
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"\"","");
    plVar8 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_220,
                                (ulong)kBUILD_DIRECTORY_KEY_abi_cxx11_._M_dataplus._M_p);
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    psVar10 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_240.field_2._M_allocated_capacity = *psVar10;
      local_240.field_2._8_8_ = plVar8[3];
    }
    else {
      local_240.field_2._M_allocated_capacity = *psVar10;
      local_240._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_240._M_string_length = plVar8[1];
    *plVar8 = (long)psVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_240);
    local_1d0.GeneratorName._M_dataplus._M_p = (pointer)&local_1d0.GeneratorName.field_2;
    psVar10 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_1d0.GeneratorName.field_2._M_allocated_capacity = *psVar10;
      local_1d0.GeneratorName.field_2._8_8_ = plVar8[3];
    }
    else {
      local_1d0.GeneratorName.field_2._M_allocated_capacity = *psVar10;
      local_1d0.GeneratorName._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_1d0.GeneratorName._M_string_length = plVar8[1];
    *plVar8 = (long)psVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    if (errorMessage != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)errorMessage);
    }
    goto LAB_00257a8b;
  }
  this_00 = (this->super_cmServerProtocol).m_CMakeInstance._M_t.
            super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
            super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
            super__Head_base<0UL,_cmake_*,_false>._M_head_impl;
  bVar2 = cmsys::SystemTools::PathExists(&local_110);
  if (bVar2) {
    bVar2 = cmsys::SystemTools::FileIsDirectory(&local_110);
    if (!bVar2) {
      local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"\"","");
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append
                         ((char *)&local_220,(ulong)kBUILD_DIRECTORY_KEY_abi_cxx11_._M_dataplus._M_p
                         );
      local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
      psVar10 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_240.field_2._M_allocated_capacity = *psVar10;
        local_240.field_2._8_8_ = puVar6[3];
      }
      else {
        local_240.field_2._M_allocated_capacity = *psVar10;
        local_240._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_240._M_string_length = puVar6[1];
      *puVar6 = psVar10;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_240);
      local_1d0.GeneratorName._M_dataplus._M_p = (pointer)&local_1d0.GeneratorName.field_2;
      psVar10 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_1d0.GeneratorName.field_2._M_allocated_capacity = *psVar10;
        local_1d0.GeneratorName.field_2._8_8_ = plVar8[3];
      }
      else {
        local_1d0.GeneratorName.field_2._M_allocated_capacity = *psVar10;
        local_1d0.GeneratorName._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_1d0.GeneratorName._M_string_length = plVar8[1];
      *plVar8 = (long)psVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      if (errorMessage != (string *)0x0) {
        std::__cxx11::string::_M_assign((string *)errorMessage);
      }
      goto LAB_00257a8b;
    }
    cmake::FindCacheFile(&local_1d0.GeneratorName,&local_110);
    bVar2 = cmake::LoadCache(this_00,&local_1d0.GeneratorName);
    if (!bVar2) {
LAB_00257384:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0.GeneratorName._M_dataplus._M_p != &local_1d0.GeneratorName.field_2) {
        operator_delete(local_1d0.GeneratorName._M_dataplus._M_p,
                        local_1d0.GeneratorName.field_2._M_allocated_capacity + 1);
      }
      goto LAB_002573a5;
    }
    state = this_00->State;
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"CMAKE_GENERATOR","");
    paVar1 = &local_220.field_2;
    local_220._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"generator","");
    bVar2 = testValue(state,&local_240,&local_1f0,&local_220,errorMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != paVar1) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
    if (bVar2) {
      local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_240,"CMAKE_EXTRA_GENERATOR","");
      local_220._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"extra generator","");
      bVar2 = testValue(state,&local_240,&local_f0,&local_220,errorMessage);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != paVar1) {
        operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      }
      if ((bVar2) && (bVar2 = testHomeDirectory(state,&local_d0,errorMessage), bVar2)) {
        local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_240,"CMAKE_GENERATOR_TOOLSET","");
        local_220._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"toolset","");
        bVar2 = testValue(state,&local_240,&local_88,&local_220,errorMessage);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != paVar1) {
          operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_dataplus._M_p != &local_240.field_2) {
          operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
        }
        if (bVar2) {
          local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_240,"CMAKE_GENERATOR_PLATFORM","");
          local_220._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"platform","");
          bVar2 = testValue(state,&local_240,&local_a8,&local_220,errorMessage);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_220._M_dataplus._M_p != paVar1) {
            operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_240._M_dataplus._M_p != &local_240.field_2) {
            operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
          }
          if (bVar2) goto LAB_00257384;
        }
      }
    }
    uVar11 = local_1d0.GeneratorName.field_2._M_allocated_capacity;
    _Var12._M_p = local_1d0.GeneratorName._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0.GeneratorName._M_dataplus._M_p != &local_1d0.GeneratorName.field_2)
    goto LAB_00257acb;
  }
  else {
LAB_002573a5:
    if (local_d0._M_string_length == 0) {
      local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"\"","");
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append
                         ((char *)&local_220,
                          (ulong)kSOURCE_DIRECTORY_KEY_abi_cxx11_._M_dataplus._M_p);
      local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
      psVar10 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_240.field_2._M_allocated_capacity = *psVar10;
        local_240.field_2._8_8_ = puVar6[3];
      }
      else {
        local_240.field_2._M_allocated_capacity = *psVar10;
        local_240._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_240._M_string_length = puVar6[1];
      *puVar6 = psVar10;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_240);
      local_1d0.GeneratorName._M_dataplus._M_p = (pointer)&local_1d0.GeneratorName.field_2;
      psVar10 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_1d0.GeneratorName.field_2._M_allocated_capacity = *psVar10;
        local_1d0.GeneratorName.field_2._8_8_ = plVar8[3];
      }
      else {
        local_1d0.GeneratorName.field_2._M_allocated_capacity = *psVar10;
        local_1d0.GeneratorName._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_1d0.GeneratorName._M_string_length = plVar8[1];
      *plVar8 = (long)psVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      if (errorMessage != (string *)0x0) {
        std::__cxx11::string::_M_assign((string *)errorMessage);
      }
    }
    else {
      bVar2 = cmsys::SystemTools::FileIsDirectory(&local_d0);
      if (bVar2) {
        if (local_1f0._M_string_length != 0) {
          local_68.super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>.
          _M_impl.super__Vector_impl_data._M_start = (GeneratorInfo *)0x0;
          local_68.super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>.
          _M_impl.super__Vector_impl_data._M_finish = (GeneratorInfo *)0x0;
          local_68.super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          cmake::GetRegisteredGenerators(this_00,&local_68);
          __n_00 = local_1f0._M_string_length;
          _Var12._M_p = local_1f0._M_dataplus._M_p;
          lVar5 = (long)local_68.
                        super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_68.
                        super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          lVar13 = (lVar5 >> 3) * 0x4ec4ec4ec4ec4ec5 >> 2;
          pGVar9 = local_68.
                   super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          _Var7._M_current =
               local_68.
               super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>.
               _M_impl.super__Vector_impl_data._M_start;
          __last._M_current =
               local_68.
               super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (0 < lVar13) {
            local_1f8 = local_68.
                        super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            local_b0 = local_68.
                       super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar13 * 4;
            lVar13 = lVar13 + 1;
            local_200 = local_68.
                        super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            pGVar9 = local_68.
                     super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start + 2;
            do {
              if ((__n_00 == pGVar9[-2].name._M_string_length) &&
                 ((__n_00 == 0 ||
                  (iVar3 = bcmp(pGVar9[-2].name._M_dataplus._M_p,_Var12._M_p,__n_00), iVar3 == 0))))
              {
                pGVar9 = pGVar9 + -2;
                _Var7._M_current = local_200;
                __last._M_current = local_1f8;
                goto LAB_00257c50;
              }
              if ((__n_00 == pGVar9[-1].name._M_string_length) &&
                 ((__n_00 == 0 ||
                  (iVar3 = bcmp(pGVar9[-1].name._M_dataplus._M_p,_Var12._M_p,__n_00), iVar3 == 0))))
              {
                pGVar9 = pGVar9 + -1;
                _Var7._M_current = local_200;
                __last._M_current = local_1f8;
                goto LAB_00257c50;
              }
              if ((__n_00 == (pGVar9->name)._M_string_length) &&
                 ((_Var7._M_current = local_200, __last._M_current = local_1f8, __n_00 == 0 ||
                  (iVar3 = bcmp((pGVar9->name)._M_dataplus._M_p,_Var12._M_p,__n_00),
                  _Var7._M_current = local_200, __last._M_current = local_1f8, iVar3 == 0))))
              goto LAB_00257c50;
              if ((__n_00 == pGVar9[1].name._M_string_length) &&
                 ((__n_00 == 0 ||
                  (iVar3 = bcmp(pGVar9[1].name._M_dataplus._M_p,_Var12._M_p,__n_00), iVar3 == 0))))
              {
                pGVar9 = pGVar9 + 1;
                _Var7._M_current = local_200;
                __last._M_current = local_1f8;
                goto LAB_00257c50;
              }
              lVar13 = lVar13 + -1;
              pGVar9 = pGVar9 + 4;
            } while (1 < lVar13);
            lVar5 = (long)local_1f8 - (long)local_b0;
            pGVar9 = local_b0;
            _Var7._M_current = local_200;
            __last._M_current = local_1f8;
          }
          lVar5 = (lVar5 >> 3) * 0x4ec4ec4ec4ec4ec5;
          if (lVar5 == 3) {
            __n = (pGVar9->name)._M_string_length;
            if ((local_1f0._M_string_length != __n) ||
               ((__n != 0 &&
                (iVar3 = bcmp((pGVar9->name)._M_dataplus._M_p,local_1f0._M_dataplus._M_p,__n),
                iVar3 != 0)))) {
              pGVar9 = pGVar9 + 1;
              goto LAB_00257bef;
            }
LAB_00257c50:
            if (pGVar9 == __last._M_current) goto LAB_00257cce;
            __pred.extraGenerator = &local_f0;
            __pred.generator = &local_1f0;
            _Var7 = std::
                    find_if<__gnu_cxx::__normal_iterator<cmake::GeneratorInfo*,std::vector<cmake::GeneratorInfo,std::allocator<cmake::GeneratorInfo>>>,cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::__1>
                              (_Var7,__last,__pred);
            if (_Var7._M_current == __last._M_current) {
              std::operator+(&local_50,"The combination of generator \"",&local_1f0);
              plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
              psVar10 = (size_type *)(plVar8 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar8 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar10) {
                local_220.field_2._M_allocated_capacity = *psVar10;
                local_220.field_2._8_8_ = plVar8[3];
                local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
              }
              else {
                local_220.field_2._M_allocated_capacity = *psVar10;
                local_220._M_dataplus._M_p = (pointer)*plVar8;
              }
              local_220._M_string_length = plVar8[1];
              *plVar8 = (long)psVar10;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              std::operator+(&local_240,&local_220,&local_f0);
              plVar8 = (long *)std::__cxx11::string::append((char *)&local_240);
              paVar1 = &local_1d0.GeneratorName.field_2;
              psVar10 = (size_type *)(plVar8 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar8 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar10) {
                local_1d0.GeneratorName.field_2._M_allocated_capacity = *psVar10;
                local_1d0.GeneratorName.field_2._8_8_ = plVar8[3];
                local_1d0.GeneratorName._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                local_1d0.GeneratorName.field_2._M_allocated_capacity = *psVar10;
                local_1d0.GeneratorName._M_dataplus._M_p = (pointer)*plVar8;
              }
              local_1d0.GeneratorName._M_string_length = plVar8[1];
              *plVar8 = (long)psVar10;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              if (errorMessage != (string *)0x0) {
                std::__cxx11::string::_M_assign((string *)errorMessage);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1d0.GeneratorName._M_dataplus._M_p != paVar1) {
                operator_delete(local_1d0.GeneratorName._M_dataplus._M_p,
                                local_1d0.GeneratorName.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_240._M_dataplus._M_p != &local_240.field_2) {
                operator_delete(local_240._M_dataplus._M_p,
                                local_240.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_220._M_dataplus._M_p != &local_220.field_2) {
                operator_delete(local_220._M_dataplus._M_p,
                                local_220.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_00257ff6;
              goto LAB_00257fee;
            }
            if (((_Var7._M_current)->supportsToolset == false) && (local_88._M_string_length != 0))
            {
              local_1d0.GeneratorName._M_dataplus._M_p = (pointer)&local_1d0.GeneratorName.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1d0,
                         "Toolset was provided but is not supported by the requested generator.","")
              ;
              if (errorMessage != (string *)0x0) {
                std::__cxx11::string::_M_assign((string *)errorMessage);
              }
LAB_00257e64:
              local_50.field_2._M_allocated_capacity =
                   local_1d0.GeneratorName.field_2._M_allocated_capacity;
              local_50._M_dataplus._M_p = local_1d0.GeneratorName._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1d0.GeneratorName._M_dataplus._M_p != &local_1d0.GeneratorName.field_2)
              goto LAB_00257fee;
              goto LAB_00257ff6;
            }
            if (((_Var7._M_current)->supportsPlatform == false) && (local_a8._M_string_length != 0))
            {
              local_1d0.GeneratorName._M_dataplus._M_p = (pointer)&local_1d0.GeneratorName.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1d0,
                         "Platform was provided but is not supported by the requested generator.",""
                        );
              if (errorMessage != (string *)0x0) {
                std::__cxx11::string::_M_assign((string *)errorMessage);
              }
              goto LAB_00257e64;
            }
            GeneratorInformation::GeneratorInformation
                      (&local_1d0,&local_1f0,&local_f0,&local_88,&local_a8,&local_d0,&local_110);
            GeneratorInformation::operator=(&this->GeneratorInfo,&local_1d0);
            GeneratorInformation::~GeneratorInformation(&local_1d0);
            this->m_State = STATE_ACTIVE;
            bVar2 = true;
          }
          else {
            if (lVar5 == 2) {
LAB_00257bef:
              if ((local_1f0._M_string_length != (pGVar9->name)._M_string_length) ||
                 ((local_1f0._M_string_length != 0 &&
                  (iVar3 = bcmp((pGVar9->name)._M_dataplus._M_p,local_1f0._M_dataplus._M_p,
                                local_1f0._M_string_length), iVar3 != 0)))) {
                pGVar9 = pGVar9 + 1;
                goto LAB_00257c14;
              }
              goto LAB_00257c50;
            }
            if (lVar5 == 1) {
LAB_00257c14:
              if ((local_1f0._M_string_length == (pGVar9->name)._M_string_length) &&
                 ((local_1f0._M_string_length == 0 ||
                  (iVar3 = bcmp((pGVar9->name)._M_dataplus._M_p,local_1f0._M_dataplus._M_p,
                                local_1f0._M_string_length), iVar3 == 0)))) goto LAB_00257c50;
            }
LAB_00257cce:
            local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"Generator \"","");
            std::operator+(&local_240,&local_220,&local_1f0);
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_240);
            paVar1 = &local_1d0.GeneratorName.field_2;
            psVar10 = (size_type *)(plVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar10) {
              local_1d0.GeneratorName.field_2._M_allocated_capacity = *psVar10;
              local_1d0.GeneratorName.field_2._8_8_ = plVar8[3];
              local_1d0.GeneratorName._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_1d0.GeneratorName.field_2._M_allocated_capacity = *psVar10;
              local_1d0.GeneratorName._M_dataplus._M_p = (pointer)*plVar8;
            }
            local_1d0.GeneratorName._M_string_length = plVar8[1];
            *plVar8 = (long)psVar10;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            if (errorMessage != (string *)0x0) {
              std::__cxx11::string::_M_assign((string *)errorMessage);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d0.GeneratorName._M_dataplus._M_p != paVar1) {
              operator_delete(local_1d0.GeneratorName._M_dataplus._M_p,
                              local_1d0.GeneratorName.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_240._M_dataplus._M_p != &local_240.field_2) {
              operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1
                             );
            }
            local_50.field_2._M_allocated_capacity = local_220.field_2._M_allocated_capacity;
            local_50._M_dataplus._M_p = local_220._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_220._M_dataplus._M_p != &local_220.field_2) {
LAB_00257fee:
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
LAB_00257ff6:
            bVar2 = false;
          }
          std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::~vector
                    (&local_68);
          goto LAB_00257ad5;
        }
        local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"\"","");
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_220,(ulong)kGENERATOR_KEY_abi_cxx11_._M_dataplus._M_p);
        local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
        psVar10 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_240.field_2._M_allocated_capacity = *psVar10;
          local_240.field_2._8_8_ = puVar6[3];
        }
        else {
          local_240.field_2._M_allocated_capacity = *psVar10;
          local_240._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_240._M_string_length = puVar6[1];
        *puVar6 = psVar10;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_240);
        local_1d0.GeneratorName._M_dataplus._M_p = (pointer)&local_1d0.GeneratorName.field_2;
        psVar10 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_1d0.GeneratorName.field_2._M_allocated_capacity = *psVar10;
          local_1d0.GeneratorName.field_2._8_8_ = plVar8[3];
        }
        else {
          local_1d0.GeneratorName.field_2._M_allocated_capacity = *psVar10;
          local_1d0.GeneratorName._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_1d0.GeneratorName._M_string_length = plVar8[1];
        *plVar8 = (long)psVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        if (errorMessage != (string *)0x0) {
          std::__cxx11::string::_M_assign((string *)errorMessage);
        }
      }
      else {
        local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"\"","");
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_220,
                            (ulong)kSOURCE_DIRECTORY_KEY_abi_cxx11_._M_dataplus._M_p);
        local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
        psVar10 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_240.field_2._M_allocated_capacity = *psVar10;
          local_240.field_2._8_8_ = puVar6[3];
        }
        else {
          local_240.field_2._M_allocated_capacity = *psVar10;
          local_240._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_240._M_string_length = puVar6[1];
        *puVar6 = psVar10;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_240);
        local_1d0.GeneratorName._M_dataplus._M_p = (pointer)&local_1d0.GeneratorName.field_2;
        psVar10 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_1d0.GeneratorName.field_2._M_allocated_capacity = *psVar10;
          local_1d0.GeneratorName.field_2._8_8_ = plVar8[3];
        }
        else {
          local_1d0.GeneratorName.field_2._M_allocated_capacity = *psVar10;
          local_1d0.GeneratorName._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_1d0.GeneratorName._M_string_length = plVar8[1];
        *plVar8 = (long)psVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        if (errorMessage != (string *)0x0) {
          std::__cxx11::string::_M_assign((string *)errorMessage);
        }
      }
    }
LAB_00257a8b:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0.GeneratorName._M_dataplus._M_p != &local_1d0.GeneratorName.field_2) {
      operator_delete(local_1d0.GeneratorName._M_dataplus._M_p,
                      local_1d0.GeneratorName.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
    uVar11 = local_220.field_2._M_allocated_capacity;
    _Var12._M_p = local_220._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
LAB_00257acb:
      operator_delete(_Var12._M_p,uVar11 + 1);
    }
  }
  bVar2 = false;
LAB_00257ad5:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool cmServerProtocol1::DoActivate(const cmServerRequest& request,
                                   std::string* errorMessage)
{
  std::string sourceDirectory = request.Data[kSOURCE_DIRECTORY_KEY].asString();
  const std::string buildDirectory =
    request.Data[kBUILD_DIRECTORY_KEY].asString();
  std::string generator = request.Data[kGENERATOR_KEY].asString();
  std::string extraGenerator = request.Data[kEXTRA_GENERATOR_KEY].asString();
  std::string toolset = request.Data[kTOOLSET_KEY].asString();
  std::string platform = request.Data[kPLATFORM_KEY].asString();

  if (buildDirectory.empty()) {
    setErrorMessage(errorMessage, std::string("\"") + kBUILD_DIRECTORY_KEY +
                      "\" is missing.");
    return false;
  }

  cmake* cm = CMakeInstance();
  if (cmSystemTools::PathExists(buildDirectory)) {
    if (!cmSystemTools::FileIsDirectory(buildDirectory)) {
      setErrorMessage(errorMessage, std::string("\"") + kBUILD_DIRECTORY_KEY +
                        "\" exists but is not a directory.");
      return false;
    }

    const std::string cachePath = cm->FindCacheFile(buildDirectory);
    if (cm->LoadCache(cachePath)) {
      cmState* state = cm->GetState();

      // Check generator:
      if (!testValue(state, "CMAKE_GENERATOR", generator, "generator",
                     errorMessage)) {
        return false;
      }

      // check extra generator:
      if (!testValue(state, "CMAKE_EXTRA_GENERATOR", extraGenerator,
                     "extra generator", errorMessage)) {
        return false;
      }

      // check sourcedir:
      if (!testHomeDirectory(state, sourceDirectory, errorMessage)) {
        return false;
      }

      // check toolset:
      if (!testValue(state, "CMAKE_GENERATOR_TOOLSET", toolset, "toolset",
                     errorMessage)) {
        return false;
      }

      // check platform:
      if (!testValue(state, "CMAKE_GENERATOR_PLATFORM", platform, "platform",
                     errorMessage)) {
        return false;
      }
    }
  }

  if (sourceDirectory.empty()) {
    setErrorMessage(errorMessage, std::string("\"") + kSOURCE_DIRECTORY_KEY +
                      "\" is unset but required.");
    return false;
  }
  if (!cmSystemTools::FileIsDirectory(sourceDirectory)) {
    setErrorMessage(errorMessage, std::string("\"") + kSOURCE_DIRECTORY_KEY +
                      "\" is not a directory.");
    return false;
  }
  if (generator.empty()) {
    setErrorMessage(errorMessage, std::string("\"") + kGENERATOR_KEY +
                      "\" is unset but required.");
    return false;
  }

  std::vector<cmake::GeneratorInfo> generators;
  cm->GetRegisteredGenerators(generators);
  auto baseIt = std::find_if(generators.begin(), generators.end(),
                             [&generator](const cmake::GeneratorInfo& info) {
                               return info.name == generator;
                             });
  if (baseIt == generators.end()) {
    setErrorMessage(errorMessage, std::string("Generator \"") + generator +
                      "\" not supported.");
    return false;
  }
  auto extraIt = std::find_if(
    generators.begin(), generators.end(),
    [&generator, &extraGenerator](const cmake::GeneratorInfo& info) {
      return info.baseName == generator && info.extraName == extraGenerator;
    });
  if (extraIt == generators.end()) {
    setErrorMessage(errorMessage,
                    std::string("The combination of generator \"" + generator +
                                "\" and extra generator \"" + extraGenerator +
                                "\" is not supported."));
    return false;
  }
  if (!extraIt->supportsToolset && !toolset.empty()) {
    setErrorMessage(errorMessage,
                    std::string("Toolset was provided but is not supported by "
                                "the requested generator."));
    return false;
  }
  if (!extraIt->supportsPlatform && !platform.empty()) {
    setErrorMessage(errorMessage,
                    std::string("Platform was provided but is not supported "
                                "by the requested generator."));
    return false;
  }

  this->GeneratorInfo =
    GeneratorInformation(generator, extraGenerator, toolset, platform,
                         sourceDirectory, buildDirectory);

  this->m_State = STATE_ACTIVE;
  return true;
}